

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O1

void Diligent::BasicFileSystem::GetPathComponents(String *Path,String *Directory,String *FileName)

{
  long lVar1;
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::find_last_of((char *)Path,0x329513,0xffffffffffffffff);
  if (Directory != (String *)0x0) {
    if (lVar1 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)Directory,0,(char *)Directory->_M_string_length,0x33d419);
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)Path);
      std::__cxx11::string::operator=((string *)Directory,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  if (FileName != (String *)0x0) {
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)FileName);
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)Path);
      std::__cxx11::string::operator=((string *)FileName,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void BasicFileSystem::GetPathComponents(const String& Path,
                                        String*       Directory,
                                        String*       FileName)
{
    auto LastSlashPos = Path.find_last_of("/\\");
    if (Directory)
    {
        if (LastSlashPos != String::npos)
            *Directory = Path.substr(0, LastSlashPos);
        else
            *Directory = "";
    }

    if (FileName)
    {
        if (LastSlashPos != String::npos)
            *FileName = Path.substr(LastSlashPos + 1);
        else
            *FileName = Path;
    }
}